

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,string *filename,ifstream *infile)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  FILE *__stream;
  uint64_t __off;
  ostream *poVar1;
  runtime_error *prVar2;
  SDG_FILETYPE type;
  sdgVersion_t version;
  uint64_t s;
  sdgMagic_t magic;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  LinkedReadsMapper *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  LinkedReadsMapper::LinkedReadsMapper(&this->mapper,ws,this);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->default_name)._M_dataplus._M_p = (pointer)&(this->default_name).field_2;
  (this->default_name)._M_string_length = 0;
  (this->default_name).field_2._M_local_buf[0] = '\0';
  local_e0 = &this->read_tag;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fd = (FILE *)0x0;
  this->ws = ws;
  local_b8 = &this->mapper;
  std::__cxx11::string::_M_assign((string *)filename);
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  this->fd = (FILE *)__stream;
  fread(&magic,2,1,__stream);
  fread(&version,2,1,(FILE *)this->fd);
  fread(&type,2,1,(FILE *)this->fd);
  this_00 = local_e0;
  if (magic != 0x5d6) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_d8,"Magic number not present in ",filename);
    std::runtime_error::runtime_error(prVar2,(string *)&local_d8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (2 < version) {
    if (type == 3) {
      std::istream::read((char *)infile,(long)&this->readsize);
      std::istream::read((char *)infile,(long)&s);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,s);
      std::istream::read((char *)infile,
                         (long)(this_00->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start);
      __off = std::istream::tellg();
      this->readpos_offset = __off;
      fseek((FILE *)this->fd,__off,0);
      std::istream::seekg((long)infile,((int)this->readsize + 1) * (int)s * 2);
      poVar1 = sdglib::OutputLog(INFO,true);
      poVar1 = std::operator<<(poVar1,"LinkedReadsDatastore open: ");
      poVar1 = std::operator<<(poVar1,(string *)filename);
      poVar1 = std::operator<<(poVar1,"  max read length: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1," Total reads: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      return;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_b0,(uint)type);
    std::operator+(&local_90,"File type supplied: ",&local_b0);
    std::operator+(&local_d8,&local_90," is not compatible with LinkedDS_FT");
    std::runtime_error::runtime_error(prVar2,(string *)&local_d8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_50,(uint)version);
  std::operator+(&local_b0,"LinkedDS file version: ",&local_50);
  std::operator+(&local_90,&local_b0," is not compatible with ");
  std::__cxx11::to_string(&local_70,3);
  std::operator+(&local_d8,&local_90,&local_70);
  std::runtime_error::runtime_error(prVar2,(string *)&local_d8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, std::string filename, std::ifstream &infile) : ws(ws), mapper(ws, *this) {
    uint64_t s;
    filename=filename;
    fd=fopen(filename.c_str(),"r");
    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    fread((char *) &magic, sizeof(magic),1,fd);
    fread((char *) &version, sizeof(version),1,fd);
    fread((char *) &type, sizeof(type),1,fd);

    if (magic != SDG_MAGIC) {
        throw std::runtime_error("Magic number not present in " + filename);
    }

    if (version < min_compat) {
        throw std::runtime_error("LinkedDS file version: " + std::to_string(version) + " is not compatible with " + std::to_string(min_compat));
    }

    if (type != LinkedDS_FT) {
        throw std::runtime_error("File type supplied: " + std::to_string(type) + " is not compatible with LinkedDS_FT");
    }

    infile.read( (char *) &readsize,sizeof(readsize));
    infile.read( (char *) &s,sizeof(s));
    read_tag.resize(s);
    infile.read( (char *) read_tag.data(),sizeof(read_tag[0])*s);
    readpos_offset=infile.tellg();
    fseek(fd,readpos_offset,SEEK_SET);
    infile.seekg(2*s*(readsize+1),std::ios_base::cur);
    sdglib::OutputLog()<<"LinkedReadsDatastore open: "<<filename<<"  max read length: "<<readsize<<" Total reads: " <<size()<<std::endl;
}